

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

bool __thiscall ClipperLib::Clipper::FixupIntersections(Clipper *this)

{
  IntersectNode *int1;
  TEdge *edge1;
  TEdge *edge2;
  IntersectNode *int2;
  IntersectNode **ppIVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->m_IntersectNodes->next != (IntersectNode *)0x0) {
    ppIVar1 = &this->m_IntersectNodes;
    CopyAELToSEL(this);
    while( true ) {
      int1 = *ppIVar1;
      int2 = int1->next;
      if (int2 == (IntersectNode *)0x0) break;
      edge1 = int1->edge1;
      edge2 = edge1->prevInSEL;
      if ((edge2 != int1->edge2) && (edge2 = edge1->nextInSEL, edge2 != int1->edge2)) {
        while( true ) {
          if (int2 == (IntersectNode *)0x0) {
            return false;
          }
          if ((int2->edge1->nextInSEL == int2->edge2) || (int2->edge1->prevInSEL == int2->edge2))
          break;
          int2 = int2->next;
        }
        SwapIntersectNodes(int1,int2);
        edge1 = int1->edge1;
        edge2 = int1->edge2;
      }
      ppIVar1 = &int1->next;
      SwapPositionsInSEL(this,edge1,edge2);
    }
    this->m_SortedEdges = (TEdge *)0x0;
    if (int1->edge1->prevInSEL != int1->edge2) {
      bVar2 = int1->edge1->nextInSEL == int1->edge2;
    }
  }
  return bVar2;
}

Assistant:

bool Clipper::FixupIntersections()
{
  if ( !m_IntersectNodes->next ) return true;

  CopyAELToSEL();
  IntersectNode *int1 = m_IntersectNodes;
  IntersectNode *int2 = m_IntersectNodes->next;
  while (int2)
  {
    TEdge *e1 = int1->edge1;
    TEdge *e2;
    if (e1->prevInSEL == int1->edge2) e2 = e1->prevInSEL;
    else if (e1->nextInSEL == int1->edge2) e2 = e1->nextInSEL;
    else
    {
      //The current intersection is out of order, so try and swap it with
      //a subsequent intersection ...
      while (int2)
      {
        if (int2->edge1->nextInSEL == int2->edge2 ||
          int2->edge1->prevInSEL == int2->edge2) break;
        else int2 = int2->next;
      }
      if ( !int2 ) return false; //oops!!!

      //found an intersect node that can be swapped ...
      SwapIntersectNodes(*int1, *int2);
      e1 = int1->edge1;
      e2 = int1->edge2;
    }
    SwapPositionsInSEL(e1, e2);
    int1 = int1->next;
    int2 = int1->next;
  }

  m_SortedEdges = 0;

  //finally, check the last intersection too ...
  return (int1->edge1->prevInSEL == int1->edge2 ||
    int1->edge1->nextInSEL == int1->edge2);
}